

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O2

void helicsInputSetMinimumChange(HelicsInput inp,double tolerance,HelicsError *err)

{
  Input *pIVar1;
  InputObject *pIVar2;
  
  pIVar2 = anon_unknown.dwarf_694c0::verifyInput(inp,err);
  if (pIVar2 != (InputObject *)0x0) {
    pIVar1 = pIVar2->inputPtr;
    if (pIVar1->delta <= 0.0 && pIVar1->delta != 0.0) {
      pIVar1->changeDetectionEnabled = true;
    }
    pIVar1->delta = tolerance;
    if (tolerance < 0.0) {
      pIVar1->changeDetectionEnabled = false;
    }
  }
  return;
}

Assistant:

void helicsInputSetMinimumChange(HelicsInput inp, double tolerance, HelicsError* err)
{
    auto* inpObj = verifyInput(inp, err);
    if (inpObj == nullptr) {
        return;
    }
    inpObj->inputPtr->setMinimumChange(tolerance);
}